

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::NewActiveCornerReached
          (MeshEdgebreakerTraversalValenceDecoder *this,CornerIndex corner)

{
  CornerIndex CVar1;
  ulong uVar2;
  CornerIndex CVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  pointer piVar8;
  CornerTable *pCVar9;
  ulong uVar10;
  
  CVar1.value_ = corner.value_;
  if (corner.value_ != 0xffffffff) {
    CVar1.value_ = corner.value_ - 2;
    if (0x55555555 < (corner.value_ + 1) * -0x55555555) {
      CVar1.value_ = corner.value_ + 1;
    }
  }
  CVar3.value_ = corner.value_;
  if (corner.value_ != 0xffffffff) {
    CVar3.value_ = ((corner.value_ * -0x55555555 < 0x55555556) - 1 | 2) + corner.value_;
  }
  uVar2 = 0xffffffff;
  switch(this->last_symbol_) {
  case 0:
  case 1:
    pCVar9 = this->corner_table_;
    uVar10 = 0xffffffff;
    if (CVar1.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[CVar1.value_].value_;
    }
    piVar8 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = piVar8 + uVar10;
    *piVar5 = *piVar5 + 1;
    uVar10 = 0xffffffff;
    if (CVar3.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[CVar3.value_].value_;
    }
    piVar5 = piVar8 + uVar10;
    break;
  default:
    goto switchD_00132c39_caseD_2;
  case 3:
    pCVar9 = this->corner_table_;
    uVar10 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar8 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8[uVar10] = piVar8[uVar10] + 1;
    uVar10 = 0xffffffff;
    if (CVar1.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[CVar1.value_].value_;
    }
    piVar8[uVar10] = piVar8[uVar10] + 2;
    uVar10 = 0xffffffff;
    if (CVar3.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[CVar3.value_].value_;
    }
    piVar5 = piVar8 + uVar10;
    break;
  case 5:
    pCVar9 = this->corner_table_;
    uVar10 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar8 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8[uVar10] = piVar8[uVar10] + 1;
    uVar10 = 0xffffffff;
    if (CVar1.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[CVar1.value_].value_;
    }
    piVar8[uVar10] = piVar8[uVar10] + 1;
    goto LAB_00132d61;
  case 7:
    pCVar9 = this->corner_table_;
    uVar10 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar8 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8[uVar10] = piVar8[uVar10] + 2;
    uVar10 = 0xffffffff;
    if (CVar1.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[CVar1.value_].value_;
    }
    piVar8[uVar10] = piVar8[uVar10] + 2;
LAB_00132d61:
    uVar10 = 0xffffffff;
    if (CVar3.value_ != 0xffffffff) {
      uVar10 = (ulong)(pCVar9->corner_to_vertex_map_).vector_.
                      super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[CVar3.value_].value_;
    }
    piVar5 = piVar8 + uVar10;
    iVar6 = 2;
    goto LAB_00132d7e;
  }
  iVar6 = 1;
LAB_00132d7e:
  *piVar5 = *piVar5 + iVar6;
switchD_00132c39_caseD_2:
  if (CVar1.value_ != 0xffffffff) {
    uVar2 = (ulong)(this->corner_table_->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[CVar1.value_].value_;
  }
  iVar6 = (this->vertex_valences_).vector_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar2];
  iVar4 = this->max_valence_;
  if (iVar6 < this->max_valence_) {
    iVar4 = iVar6;
  }
  iVar7 = 0;
  if (this->min_valence_ <= iVar6) {
    iVar7 = iVar4 - this->min_valence_;
  }
  this->active_context_ = iVar7;
  return;
}

Assistant:

inline void NewActiveCornerReached(CornerIndex corner) {
    const CornerIndex next = corner_table_->Next(corner);
    const CornerIndex prev = corner_table_->Previous(corner);
    // Update valences.
    switch (last_symbol_) {
      case TOPOLOGY_C:
      case TOPOLOGY_S:
        vertex_valences_[corner_table_->Vertex(next)] += 1;
        vertex_valences_[corner_table_->Vertex(prev)] += 1;
        break;
      case TOPOLOGY_R:
        vertex_valences_[corner_table_->Vertex(corner)] += 1;
        vertex_valences_[corner_table_->Vertex(next)] += 1;
        vertex_valences_[corner_table_->Vertex(prev)] += 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(corner)] += 1;
        vertex_valences_[corner_table_->Vertex(next)] += 2;
        vertex_valences_[corner_table_->Vertex(prev)] += 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(corner)] += 2;
        vertex_valences_[corner_table_->Vertex(next)] += 2;
        vertex_valences_[corner_table_->Vertex(prev)] += 2;
        break;
      default:
        break;
    }
    // Compute the new context that is going to be used to decode the next
    // symbol.
    const int active_valence = vertex_valences_[corner_table_->Vertex(next)];
    int clamped_valence;
    if (active_valence < min_valence_) {
      clamped_valence = min_valence_;
    } else if (active_valence > max_valence_) {
      clamped_valence = max_valence_;
    } else {
      clamped_valence = active_valence;
    }

    active_context_ = (clamped_valence - min_valence_);
  }